

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru-cache.h
# Opt level: O0

bool __thiscall
tstarling::
ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
::insert(ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
         *this,ThreadSafeStringKey *key,int *value)

{
  bool bVar1;
  ListNode *pLVar2;
  atomic<unsigned_long> *paVar3;
  undefined1 *puVar4;
  __atomic_base<unsigned_long> _Var5;
  int *in_RDX;
  ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
  *in_RDI;
  unique_lock<std::mutex> lock;
  bool evictionDone;
  size_t size;
  HashMapValuePair hashMapValue;
  HashMapAccessor hashAccessor;
  ListNode *node;
  memory_order __b;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  __atomic_base<unsigned_long> in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>
  *in_stack_fffffffffffffd90;
  __atomic_base<unsigned_long> in_stack_fffffffffffffde0;
  __atomic_base<unsigned_long> local_100;
  undefined4 local_f4;
  HashMapValue local_f0 [6];
  ListNode *local_90;
  int *local_88;
  byte local_69;
  ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
  *local_68;
  memory_order local_60;
  int local_5c;
  atomic<unsigned_long> *local_58;
  undefined4 local_4c;
  undefined1 *local_48;
  __atomic_base<unsigned_long> *local_40;
  atomic<unsigned_long> *local_38;
  bool local_29;
  undefined1 *local_28;
  memory_order local_20;
  undefined4 local_1c;
  undefined1 *local_18;
  __atomic_base<unsigned_long> *local_10;
  atomic<unsigned_long> *local_8;
  
  local_88 = in_RDX;
  pLVar2 = (ListNode *)operator_new(0x20);
  ListNode::ListNode((ListNode *)in_stack_fffffffffffffd80._M_i,
                     (ThreadSafeStringKey *)
                     CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  local_90 = pLVar2;
  tbb::detail::d2::
  concurrent_hash_map<tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue,_tstarling::ThreadSafeStringKey::HashCompare,_tbb::detail::d1::tbb_allocator<std::pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>_>_>
  ::accessor::accessor((accessor *)0x11f943);
  HashMapValue::HashMapValue(local_f0,local_88,local_90);
  std::
  pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>
  ::
  pair<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue,_true>
            (in_stack_fffffffffffffd90,
             (ThreadSafeStringKey *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (HashMapValue *)in_stack_fffffffffffffd80._M_i);
  bVar1 = tbb::detail::d2::
          concurrent_hash_map<tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue,_tstarling::ThreadSafeStringKey::HashCompare,_tbb::detail::d1::tbb_allocator<std::pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>_>_>
          ::insert((concurrent_hash_map<tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue,_tstarling::ThreadSafeStringKey::HashCompare,_tbb::detail::d1::tbb_allocator<std::pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>_>_>
                    *)in_stack_fffffffffffffd90,
                   (accessor *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                   (value_type *)in_stack_fffffffffffffd80._M_i);
  pLVar2 = local_90;
  if (bVar1) {
    tbb::detail::d2::
    concurrent_hash_map<tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue,_tstarling::ThreadSafeStringKey::HashCompare,_tbb::detail::d1::tbb_allocator<std::pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>_>_>
    ::const_accessor::release((const_accessor *)in_stack_fffffffffffffd80._M_i);
    paVar3 = &in_RDI->m_size;
    local_5c = 5;
    local_58 = paVar3;
    local_60 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_5c - 1U < 2) {
      local_68 = (ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
                  *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_5c == 5) {
      local_68 = (ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
                  *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_68 = (ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
                  *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
    }
    local_100._M_i = (__int_type)local_68;
    bVar1 = (ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
             *)in_RDI->m_maxSize <= local_68;
    if (bVar1) {
      evict((ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
             *)in_stack_fffffffffffffde0._M_i);
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffd80._M_i,
               (mutex_type *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    pushFront(in_RDI,local_90);
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffd80._M_i);
    if (!bVar1) {
      local_100._M_i =
           std::__atomic_base<unsigned_long>::operator++
                     (&(in_RDI->m_size).super___atomic_base<unsigned_long>,0);
    }
    if ((ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
         *)in_RDI->m_maxSize < local_100._M_i) {
      paVar3 = &in_RDI->m_size;
      puVar4 = (undefined1 *)(local_100._M_i - 1);
      local_4c = 5;
      local_48 = puVar4;
      local_40 = &local_100;
      local_38 = paVar3;
      local_20 = std::__cmpexch_failure_order
                           ((memory_order)(in_stack_fffffffffffffd80._M_i >> 0x20));
      local_1c = 5;
      switch(0x11fe06) {
      default:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
        else {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
        break;
      case 2:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          in_stack_fffffffffffffde0._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == in_stack_fffffffffffffde0._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            in_stack_fffffffffffffde0._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i =
                 (__int_type)
                 (ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
                  *)in_stack_fffffffffffffde0._M_i;
          }
        }
        else {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
        break;
      case 3:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
        else {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
        break;
      case 4:
        if (local_20 - memory_order_consume < 2) {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
        else if (local_20 == memory_order_seq_cst) {
          LOCK();
          in_stack_fffffffffffffd80._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == in_stack_fffffffffffffd80._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            in_stack_fffffffffffffd80._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i =
                 (__int_type)
                 (ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
                  *)in_stack_fffffffffffffd80._M_i;
          }
        }
        else {
          LOCK();
          _Var5._M_i = (paVar3->super___atomic_base<unsigned_long>)._M_i;
          local_29 = local_100._M_i == _Var5._M_i;
          if (local_29) {
            (paVar3->super___atomic_base<unsigned_long>)._M_i = (__int_type)puVar4;
            _Var5._M_i = local_100._M_i;
          }
          UNLOCK();
          if (!local_29) {
            local_100._M_i = _Var5._M_i;
          }
        }
      }
      local_28 = puVar4;
      local_18 = puVar4;
      local_10 = &local_100;
      local_8 = paVar3;
      if (local_29 != false) {
        evict((ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
               *)in_stack_fffffffffffffde0._M_i);
      }
    }
    local_69 = 1;
    local_f4 = 1;
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffd80._M_i);
  }
  else {
    if (local_90 != (ListNode *)0x0) {
      ListNode::~ListNode((ListNode *)0x11f9ef);
      operator_delete(pLVar2);
    }
    local_69 = 0;
    local_f4 = 1;
  }
  std::
  pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>
  ::~pair((pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>
           *)0x1203df);
  tbb::detail::d2::
  concurrent_hash_map<tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue,_tstarling::ThreadSafeStringKey::HashCompare,_tbb::detail::d1::tbb_allocator<std::pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>_>_>
  ::accessor::~accessor((accessor *)0x1203ec);
  return (bool)(local_69 & 1);
}

Assistant:

bool ThreadSafeLRUCache<TKey, TValue, THash>::
insert(const TKey& key, const TValue& value) {
  // Insert into the CHM
  ListNode* node = new ListNode(key);
  HashMapAccessor hashAccessor;
  HashMapValuePair hashMapValue(key, HashMapValue(value, node));
  if (!m_map.insert(hashAccessor, hashMapValue)) {
    delete node;
    return false;
  }
  hashAccessor.release();

  // Evict if necessary, now that we know the hashmap insertion was successful.
  size_t size = m_size.load();
  bool evictionDone = false;
  if (size >= m_maxSize) {
    // The container is at (or over) capacity, so eviction needs to be done.
    // Do not decrement m_size, since that would cause other threads to
    // inappropriately omit eviction during their own inserts.
    evict();
    evictionDone = true;
  }

  // Note that we have to update the LRU list before we increment m_size, so
  // that other threads don't attempt to evict list items before they even
  // exist.
  std::unique_lock<ListMutex> lock(m_listMutex);
  pushFront(node);
  lock.unlock();
  if (!evictionDone) {
    size = m_size++;
  }
  if (size > m_maxSize) {
    // It is possible for the size to temporarily exceed the maximum if there is
    // a heavy insert() load, once only as the cache fills. In this situation,
    // we have to be careful not to have every thread simultaneously attempt to
    // evict the extra entries, since we could end up underfilled. Instead we do
    // a compare-and-exchange to acquire an exclusive right to reduce the size
    // to a particular value.
    //
    // We could continue to evict in a loop, but if there are a lot of threads
    // here at the same time, that could lead to spinning. So we will just evict
    // one extra element per insert() until the overfill is rectified.
    if (m_size.compare_exchange_strong(size, size - 1)) {
      evict();
    }
  }
  return true;
}